

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::PlatformIs32Bit(cmMakefile *this)

{
  int iVar1;
  char *pcVar2;
  allocator<char> local_81;
  string local_80;
  char *local_60;
  char *sizeof_dptr;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *plat_abi;
  cmMakefile *this_local;
  
  plat_abi = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_INTERNAL_PLATFORM_ABI",&local_41);
  pcVar2 = GetDefinition(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pcVar2;
  if ((pcVar2 == (char *)0x0) || (iVar1 = strcmp(pcVar2,"ELF X32"), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"CMAKE_SIZEOF_VOID_P",&local_81);
    pcVar2 = GetDefinition(this,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    if (pcVar2 == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      local_60 = pcVar2;
      iVar1 = atoi(pcVar2);
      this_local._7_1_ = iVar1 == 4;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::PlatformIs32Bit() const
{
  if (const char* plat_abi =
        this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (strcmp(plat_abi, "ELF X32") == 0) {
      return false;
    }
  }
  if (const char* sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr) == 4;
  }
  return false;
}